

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

ggml_cgraph * magika_graph(magika_model *model,int n_files)

{
  int iVar1;
  long lVar2;
  long lVar3;
  undefined8 uVar4;
  ggml_cgraph *pgVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  int in_ESI;
  long in_RDI;
  ggml_tensor *cur;
  ggml_tensor *input;
  ggml_cgraph *gf;
  ggml_context *ctx;
  ggml_init_params params;
  magika_hparams *hparams;
  allocator_type *in_stack_ffffffffffffff40;
  size_type in_stack_ffffffffffffff48;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff50;
  
  if (magika_graph(magika_model_const&,int)::buf_size == '\0') {
    iVar1 = __cxa_guard_acquire(&magika_graph(magika_model_const&,int)::buf_size);
    if (iVar1 != 0) {
      lVar2 = ggml_tensor_overhead();
      lVar3 = ggml_graph_overhead();
      magika_graph::buf_size = lVar2 * 0x800 + lVar3;
      __cxa_guard_release(&magika_graph(magika_model_const&,int)::buf_size);
    }
  }
  if (magika_graph(magika_model_const&,int)::buf == '\0') {
    iVar1 = __cxa_guard_acquire(&magika_graph(magika_model_const&,int)::buf);
    if (iVar1 != 0) {
      std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x107ffe);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
      std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x108023);
      __cxa_atexit(std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector,
                   &magika_graph::buf,&__dso_handle);
      __cxa_guard_release(&magika_graph(magika_model_const&,int)::buf);
    }
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x108064);
  uVar4 = ggml_init();
  pgVar5 = (ggml_cgraph *)ggml_new_graph(uVar4);
  uVar6 = ggml_new_tensor_3d(uVar4,0,0x101,0x600,(long)in_ESI);
  ggml_set_name(uVar6,"input");
  ggml_set_input(uVar6);
  uVar6 = ggml_mul_mat(uVar4,*(undefined8 *)(in_RDI + 0x20),uVar6);
  uVar6 = ggml_add(uVar4,uVar6,*(undefined8 *)(in_RDI + 0x28));
  uVar6 = ggml_gelu(uVar4,uVar6);
  uVar7 = ggml_reshape_3d(uVar4,uVar6,0x200,0x180,(long)in_ESI);
  uVar6 = uVar4;
  uVar7 = ggml_transpose(uVar4,uVar7);
  uVar6 = ggml_cont(uVar6,uVar7);
  uVar6 = ggml_norm(*(undefined4 *)(in_RDI + 0x18),uVar4,uVar6);
  uVar6 = ggml_mul(uVar4,uVar6,*(undefined8 *)(in_RDI + 0x30));
  uVar7 = ggml_add(uVar4,uVar6,*(undefined8 *)(in_RDI + 0x38));
  uVar6 = uVar4;
  uVar7 = ggml_transpose(uVar4,uVar7);
  uVar6 = ggml_cont(uVar6,uVar7);
  uVar6 = ggml_mul_mat(uVar4,*(undefined8 *)(in_RDI + 0x40),uVar6);
  uVar6 = ggml_add(uVar4,uVar6,*(undefined8 *)(in_RDI + 0x48));
  uVar6 = ggml_gelu(uVar4,uVar6);
  uVar6 = ggml_mul_mat(uVar4,*(undefined8 *)(in_RDI + 0x50),uVar6);
  uVar6 = ggml_add(uVar4,uVar6,*(undefined8 *)(in_RDI + 0x58));
  uVar6 = ggml_gelu(uVar4,uVar6);
  uVar6 = ggml_transpose(uVar4,uVar6);
  uVar6 = ggml_cont(uVar4,uVar6);
  uVar6 = ggml_pool_1d(uVar4,uVar6,0,0x180);
  uVar6 = ggml_reshape_2d(uVar4,uVar6,0x100,(long)in_ESI);
  uVar6 = ggml_norm(*(undefined4 *)(in_RDI + 0x18),uVar4,uVar6);
  uVar6 = ggml_mul(uVar4,uVar6,*(undefined8 *)(in_RDI + 0x60));
  uVar6 = ggml_add(uVar4,uVar6,*(undefined8 *)(in_RDI + 0x68));
  uVar6 = ggml_mul_mat(uVar4,*(undefined8 *)(in_RDI + 0x70),uVar6);
  uVar6 = ggml_add(uVar4,uVar6,*(undefined8 *)(in_RDI + 0x78));
  uVar6 = ggml_soft_max(uVar4,uVar6);
  ggml_set_name(uVar6,"target_label_probs");
  ggml_set_output(uVar6);
  ggml_build_forward_expand(pgVar5,uVar6);
  return pgVar5;
}

Assistant:

struct ggml_cgraph * magika_graph(
    const magika_model & model,
    const int n_files) {

    const auto & hparams = model.hparams;

    static size_t buf_size = ggml_tensor_overhead()*GGML_DEFAULT_GRAPH_SIZE + ggml_graph_overhead();
    static std::vector<uint8_t> buf(buf_size);

    struct ggml_init_params params = {
        /*.mem_size   =*/ buf_size,
        /*.mem_buffer =*/ buf.data(),
        /*.no_alloc   =*/ true,
    };

    struct ggml_context * ctx = ggml_init(params);

    struct ggml_cgraph * gf = ggml_new_graph(ctx);

    struct ggml_tensor * input = ggml_new_tensor_3d(ctx, GGML_TYPE_F32, 257, 1536, n_files); // one-hot
    ggml_set_name(input, "input");
    ggml_set_input(input);

    struct ggml_tensor * cur;

    // dense
    cur = ggml_mul_mat(ctx, model.dense_w, input);
    cur = ggml_add(ctx, cur, model.dense_b); // [128, 1536, n_files]
    cur = ggml_gelu(ctx, cur);

    // reshape
    cur = ggml_reshape_3d(ctx, cur, 512, 384, n_files); // [384, 512, n_files]
    cur = ggml_cont(ctx, ggml_transpose(ctx, cur));

    // layer normalization
    cur = ggml_norm(ctx, cur, hparams.f_norm_eps);
    cur = ggml_mul(ctx, cur, model.layer_norm_gamma); // [384, 512, n_files]
    cur = ggml_add(ctx, cur, model.layer_norm_beta);  // [384, 512, n_files]

    // dense_1
    cur = ggml_cont(ctx, ggml_transpose(ctx, cur));
    cur = ggml_mul_mat(ctx, model.dense_1_w, cur);
    cur = ggml_add(ctx, cur, model.dense_1_b); // [256, 384, n_files]
    cur = ggml_gelu(ctx, cur);

    // dense_2
    cur = ggml_mul_mat(ctx, model.dense_2_w, cur);
    cur = ggml_add(ctx, cur, model.dense_2_b); // [256, 384, n_files]
    cur = ggml_gelu(ctx, cur);

    // global_max_pooling1d
    cur = ggml_cont(ctx, ggml_transpose(ctx, cur)); // [384, 256, n_files]
    cur = ggml_pool_1d(ctx, cur, GGML_OP_POOL_MAX, 384, 384, 0); // [1, 256, n_files]
    cur = ggml_reshape_2d(ctx, cur, 256, n_files); // [256, n_files]

    // layer normalization 1
    cur = ggml_norm(ctx, cur, hparams.f_norm_eps);
    cur = ggml_mul(ctx, cur, model.layer_norm_1_gamma); // [256, n_files]
    cur = ggml_add(ctx, cur, model.layer_norm_1_beta);  // [256, n_files]

    // target_label
    cur = ggml_mul_mat(ctx, model.target_label_w, cur);
    cur = ggml_add(ctx, cur, model.target_label_b); // [n_label, n_files]
    cur = ggml_soft_max(ctx, cur); // [n_label, n_files]
    ggml_set_name(cur, "target_label_probs");
    ggml_set_output(cur);

    ggml_build_forward_expand(gf, cur);

    return gf;
}